

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

StuntDouble * __thiscall OpenMD::SelectionManager::nextUnselected(SelectionManager *this,int *i)

{
  int iVar1;
  StuntDouble *pSVar2;
  
  iVar1 = OpenMDBitSet::nextOffBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start,*i);
  *i = iVar1;
  if (iVar1 == -1) {
    pSVar2 = (StuntDouble *)0x0;
  }
  else {
    pSVar2 = (this->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1];
  }
  return pSVar2;
}

Assistant:

StuntDouble* SelectionManager::nextUnselected(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[STUNTDOUBLE].size())) {
      if (!ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) return stuntdoubles_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[STUNTDOUBLE].nextOffBit(i);
    return i == -1 ? NULL : stuntdoubles_[i];
#endif
  }